

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O0

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Finalize(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
           *this,bool isShutdown)

{
  uchar **ppuVar1;
  nullptr_t local_28;
  nullptr_t local_20;
  undefined1 local_11;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *pJStack_10;
  bool isShutdown_local;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  
  local_11 = isShutdown;
  pJStack_10 = this;
  ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&this->mappedSource);
  if (*ppuVar1 != (uchar *)0x0) {
    ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->mappedSource);
    JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
    FreeMappedSource(*ppuVar1,this->mappedAllocLength);
    local_20 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<const_unsigned_char>::operator=(&this->mappedSource,&local_20);
  }
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::operator=(&this->mappedScriptValue,&local_28);
  this->scriptLoadCallback = (Type)0x0;
  this->scriptUnloadCallback = (Type)0x0;
  this->sourceContext = 0;
  return;
}

Assistant:

void JsrtSourceHolder<JsSerializedLoadScriptCallback, JsSerializedScriptUnloadCallback>::Finalize(bool isShutdown)
    {
        if (this->mappedSource != nullptr)
        {
            JsrtSourceHolderPolicy<JsSerializedLoadScriptCallback>::FreeMappedSource(
                this->mappedSource, this->mappedAllocLength);
            this->mappedSource = nullptr;
        }
        this->mappedScriptValue = nullptr;

        // Don't allow load or unload again after told to unload.
        scriptLoadCallback = nullptr;
        scriptUnloadCallback = nullptr;
        sourceContext = NULL;
    }